

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  uint32 value_00;
  LogMessage *other;
  LogFinisher local_95 [20];
  byte local_81;
  LogMessage local_80;
  long local_48;
  uint8 *end;
  uint8 *target;
  CodedOutputStream *pCStack_30;
  int size;
  CodedOutputStream *output_local;
  MessageLite *value_local;
  CodedOutputStream *pCStack_18;
  int field_number_local;
  undefined4 local_10;
  int local_c;
  
  local_10 = 2;
  pCStack_30 = output;
  output_local = (CodedOutputStream *)value;
  value_local._4_4_ = field_number;
  pCStack_18 = output;
  local_c = field_number;
  value_00 = MakeTag(field_number,WIRETYPE_LENGTH_DELIMITED);
  io::CodedOutputStream::WriteTag(output,value_00);
  target._4_4_ = (*(code *)output_local->output_[0xc]._vptr_ZeroCopyOutputStream)();
  io::CodedOutputStream::WriteVarint32(pCStack_30,target._4_4_);
  end = io::CodedOutputStream::GetDirectBufferForNBytesAndAdvance(pCStack_30,target._4_4_);
  if (end == (uint8 *)0x0) {
    (*(code *)output_local->output_[10]._vptr_ZeroCopyOutputStream)(output_local,pCStack_30);
  }
  else {
    local_48 = (*(code *)output_local->output_[0xb]._vptr_ZeroCopyOutputStream)(output_local,end);
    local_81 = 0;
    if (local_48 - (long)end != (long)(int)target._4_4_) {
      LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/wire_format_lite.cc"
                 ,0x152);
      local_81 = 1;
      other = LogMessage::operator<<(&local_80,"CHECK failed: (end - target) == (size): ");
      LogFinisher::operator=(local_95,other);
    }
    if ((local_81 & 1) != 0) {
      LogMessage::~LogMessage(&local_80);
    }
  }
  return;
}

Assistant:

void WireFormatLite::WriteMessageMaybeToArray(int field_number,
                                              const MessageLite& value,
                                              io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  const int size = value.GetCachedSize();
  output->WriteVarint32(size);
  uint8* target = output->GetDirectBufferForNBytesAndAdvance(size);
  if (target != NULL) {
    uint8* end = value.SerializeWithCachedSizesToArray(target);
    GOOGLE_DCHECK_EQ(end - target, size);
  } else {
    value.SerializeWithCachedSizes(output);
  }
}